

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefFunc(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name func)

{
  Name func_00;
  Function *pFVar1;
  RefFunc *expr;
  Ok local_51;
  IRBuilder *local_50;
  char *local_48;
  uintptr_t local_40;
  IRBuilder *local_38;
  char *local_30;
  IRBuilder *local_28;
  IRBuilder *this_local;
  Name func_local;
  
  local_48 = func.super_IString.str._M_str;
  local_50 = func.super_IString.str._M_len;
  local_38 = local_50;
  local_30 = local_48;
  local_28 = this;
  this_local = local_50;
  func_local.super_IString.str._M_len = (size_t)local_48;
  func_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  pFVar1 = Module::getFunction(this->wasm,func);
  local_40 = (pFVar1->type).id;
  func_00.super_IString.str._M_str = local_30;
  func_00.super_IString.str._M_len = (size_t)local_38;
  expr = Builder::makeRefFunc(&this->builder,func_00,(HeapType)local_40);
  push(this,(Expression *)expr);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_51);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefFunc(Name func) {
  push(builder.makeRefFunc(func, wasm.getFunction(func)->type));
  return Ok{};
}